

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O0

apx_error_t
process_remote_write_definition_data
          (apx_nodeInstance_t *self,uint32_t offset,uint8_t *data,apx_size_t size)

{
  apx_error_t local_28;
  apx_error_t retval;
  apx_size_t size_local;
  uint8_t *data_local;
  uint32_t offset_local;
  apx_nodeInstance_t *self_local;
  
  if (self->definition_data_state == '\x03') {
    self->definition_data_state = '\x04';
  }
  local_28 = apx_nodeData_write_definition_data(self->node_data,offset,data,size);
  if (local_28 == 0) {
    if (self->parent == (apx_nodeManager_tag *)0x0) {
      __assert_fail("self->parent != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                    ,0x50c,
                    "apx_error_t process_remote_write_definition_data(apx_nodeInstance_t *, uint32_t, const uint8_t *, apx_size_t)"
                   );
    }
    local_28 = apx_nodeManager_on_definition_data_written(self->parent,self,offset,size);
  }
  return local_28;
}

Assistant:

static apx_error_t process_remote_write_definition_data(apx_nodeInstance_t* self, uint32_t offset, const uint8_t* data, apx_size_t size)
{
   if (self->definition_data_state == APX_DATA_STATE_WAITING_FOR_FILE_DATA)
   {
      self->definition_data_state = APX_DATA_STATE_CONNECTED;
   }
   apx_error_t retval = apx_nodeData_write_definition_data(self->node_data, offset, data, size);
   if (retval == APX_NO_ERROR)
   {
      assert(self->parent != NULL);
      retval = apx_nodeManager_on_definition_data_written(self->parent, self, offset, size);
   }
   return retval;
}